

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_delete_extver_tab(void)

{
  int iVar1;
  int i;
  int local_4;
  
  if ((ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) && (0 < ngp_extver_tab_size)) {
    local_4 = 0x170;
  }
  else if ((ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) || (0 < ngp_extver_tab_size)) {
    if ((ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) && (ngp_extver_tab_size == 0)) {
      local_4 = 0;
    }
    else {
      for (iVar1 = 0; iVar1 < ngp_extver_tab_size; iVar1 = iVar1 + 1) {
        if (ngp_extver_tab[iVar1].extname != (char *)0x0) {
          free(ngp_extver_tab[iVar1].extname);
          ngp_extver_tab[iVar1].extname = (char *)0x0;
        }
        ngp_extver_tab[iVar1].version = 0;
      }
      free(ngp_extver_tab);
      ngp_extver_tab = (NGP_EXTVER_TAB *)0x0;
      ngp_extver_tab_size = 0;
      local_4 = 0;
    }
  }
  else {
    local_4 = 0x170;
  }
  return local_4;
}

Assistant:

int	ngp_delete_extver_tab(void)
 { int i;

   if ((NULL == ngp_extver_tab) && (ngp_extver_tab_size > 0)) return(NGP_BAD_ARG);
   if ((NULL != ngp_extver_tab) && (ngp_extver_tab_size <= 0)) return(NGP_BAD_ARG);
   if ((NULL == ngp_extver_tab) && (0 == ngp_extver_tab_size)) return(NGP_OK);

   for (i=0; i<ngp_extver_tab_size; i++)
    { if (NULL != ngp_extver_tab[i].extname)
        { ngp_free(ngp_extver_tab[i].extname);
          ngp_extver_tab[i].extname = NULL;
        }
      ngp_extver_tab[i].version = 0;
    }
   ngp_free(ngp_extver_tab);
   ngp_extver_tab = NULL;
   ngp_extver_tab_size = 0;
   return(NGP_OK);
 }